

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O2

bool __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::optimizeSubsequentStructSet
          (HeapStoreOptimization *this,StructNew *new_,StructSet *set,LocalSet *localSet)

{
  ExpressionList *this_00;
  size_t *psVar1;
  size_t *__return_storage_ptr__;
  pointer puVar2;
  pointer puVar3;
  pointer pFVar4;
  bool bVar5;
  size_type sVar6;
  Expression **ppEVar7;
  Drop *left;
  Block *pBVar8;
  Struct *pSVar9;
  Expression *item;
  pointer pFVar10;
  uint uVar11;
  ulong index;
  optional<wasm::Type> type;
  undefined1 local_338 [8];
  EffectAnalyzer setValueEffects;
  EffectAnalyzer operandEffects;
  Index local_54;
  Builder BStack_50;
  Index refLocalIndex;
  Builder builder;
  
  if (((new_->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id == 1) ||
     ((set->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id == 1)) {
    return false;
  }
  uVar11 = set->index;
  index = (ulong)uVar11;
  local_54 = localSet->index;
  builder.wasm = (Module *)set;
  effects((EffectAnalyzer *)local_338,this,set->value);
  sVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &setValueEffects.features,&local_54);
  if ((sVar6 == 0) &&
     (sVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count,&local_54), sVar6 == 0)) {
    this_00 = &new_->operands;
    if ((new_->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements == 0) {
LAB_00a3201b:
      if ((((setValueEffects.module._4_1_ != '\0') || (setValueEffects.writesTable != false)) ||
          (setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
           (_Base_ptr)0x0)) ||
         (setValueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
          (_Base_ptr)0x0)) {
        if ((this->localGraph).super__Optional_base<wasm::LazyLocalGraph,_false,_false>._M_payload.
            super__Optional_payload<wasm::LazyLocalGraph,_true,_false,_false>.
            super__Optional_payload_base<wasm::LazyLocalGraph>._M_engaged == false) {
          setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)(this->
                       super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                       ).
                       super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
                       .currFunction;
          BStack_50.wasm =
               (this->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
               .
               super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
               .currModule;
          std::optional<wasm::LazyLocalGraph>::
          emplace<wasm::Function*,wasm::Module*,wasm::Expression::Id_const&>
                    (&this->localGraph,
                     (Function **)
                     &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count,&stack0xffffffffffffffb0.wasm,
                     &SpecificExpression<(wasm::Expression::Id)67>::SpecificId);
        }
        LazyLocalGraph::canMoveSet
                  ((SetInfluences *)
                   &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                   ,(LazyLocalGraph *)&this->localGraph,localSet,(Expression *)builder.wasm);
        psVar1 = &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (operandEffects._16_8_ != 0) {
          if (operandEffects._16_8_ == 1) {
            puVar2 = ((operandEffects.module)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            puVar3 = (pointer)((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)psVar1);
            if (puVar2 == puVar3) goto LAB_00a320f4;
          }
          else {
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)psVar1);
          }
          goto LAB_00a31f8c;
        }
        std::
        _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)psVar1);
      }
LAB_00a320f4:
      BStack_50.wasm =
           (this->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           .
           super_PostWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>_>
           .currModule;
      if ((new_->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements ==
          0) {
        setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)wasm::Type::getHeapType
                               (&(new_->super_SpecificExpression<(wasm::Expression::Id)65>).
                                 super_Expression.type);
        pSVar9 = HeapType::getStruct((HeapType *)
                                     &setValueEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
        pFVar4 = (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        __return_storage_ptr__ =
             &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        psVar1 = &operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        for (pFVar10 = (pSVar9->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start; pFVar10 != pFVar4; pFVar10 = pFVar10 + 1) {
          Literal::makeZero((Literal *)__return_storage_ptr__,(Type)(pFVar10->type).id);
          Literal::Literal((Literal *)psVar1,(Literal *)__return_storage_ptr__);
          item = Builder::makeConstantExpression(&stack0xffffffffffffffb0,(Literal *)psVar1);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&this_00->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     item);
          Literal::~Literal((Literal *)psVar1);
          Literal::~Literal((Literal *)__return_storage_ptr__);
        }
      }
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      effects((EffectAnalyzer *)
              &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,this
              ,*ppEVar7);
      bVar5 = EffectAnalyzer::hasUnremovableSideEffects
                        ((EffectAnalyzer *)
                         &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar5) {
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        left = Builder::makeDrop(&stack0xffffffffffffffb0,*ppEVar7);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)builder.wasm;
        pBVar8 = Builder::makeSequence
                           (&stack0xffffffffffffffb0,(Expression *)left,
                            (Expression *)
                            ((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,type);
      }
      else {
        pBVar8 = (Block *)((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      *ppEVar7 = (Expression *)pBVar8;
      bVar5 = true;
      goto LAB_00a31f8e;
    }
    psVar1 = &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      uVar11 = uVar11 + 1;
      if ((new_->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          (ulong)uVar11) goto LAB_00a3201b;
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)uVar11);
      effects((EffectAnalyzer *)psVar1,this,*ppEVar7);
      bVar5 = EffectAnalyzer::invalidates((EffectAnalyzer *)psVar1,(EffectAnalyzer *)local_338);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)psVar1);
    } while (!bVar5);
  }
LAB_00a31f8c:
  bVar5 = false;
LAB_00a31f8e:
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_338);
  return bVar5;
}

Assistant:

bool optimizeSubsequentStructSet(StructNew* new_,
                                   StructSet* set,
                                   LocalSet* localSet) {
    // Leave unreachable code for DCE, to avoid updating types here.
    if (new_->type == Type::unreachable || set->type == Type::unreachable) {
      return false;
    }

    auto index = set->index;
    auto& operands = new_->operands;
    auto refLocalIndex = localSet->index;

    // Check for effects that prevent us moving the struct.set's value (X' in
    // the function comment) into its new position in the struct.new. First, it
    // must be ok to move it past the local.set (otherwise, it might read from
    // memory using that local, and depend on the struct.new having already
    // occurred; or, if it writes to that local, then it would cross another
    // write).
    auto setValueEffects = effects(set->value);
    if (setValueEffects.localsRead.count(refLocalIndex) ||
        setValueEffects.localsWritten.count(refLocalIndex)) {
      return false;
    }

    // We must move the set's value past indexes greater than it (Y and Z in
    // the example in the comment on this function). If this is not with_default
    // then we must check for effects.
    // TODO When this function is called repeatedly in a sequence this can
    //      become quadratic - perhaps we should memoize (though, struct sizes
    //      tend to not be ridiculously large).
    if (!new_->isWithDefault()) {
      for (Index i = index + 1; i < operands.size(); i++) {
        auto operandEffects = effects(operands[i]);
        if (operandEffects.invalidates(setValueEffects)) {
          // TODO: we could use locals to reorder everything
          return false;
        }
      }
    }

    // We must also be careful of branches out from the value that skip the
    // local.set, see below.
    if (canSkipLocalSet(set, setValueEffects, localSet)) {
      return false;
    }

    // We can optimize here!
    Builder builder(*getModule());

    // If this was with_default then we add default values now. That does
    // increase code size in some cases (if there are many values, and few sets
    // that get removed), but in general this optimization is worth it.
    if (new_->isWithDefault()) {
      auto& fields = new_->type.getHeapType().getStruct().fields;
      for (auto& field : fields) {
        auto zero = Literal::makeZero(field.type);
        operands.push_back(builder.makeConstantExpression(zero));
      }
    }

    // See if we need to keep the old value.
    if (effects(operands[index]).hasUnremovableSideEffects()) {
      operands[index] =
        builder.makeSequence(builder.makeDrop(operands[index]), set->value);
    } else {
      operands[index] = set->value;
    }

    return true;
  }